

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  char cVar1;
  ImDrawIdx *pIVar2;
  ImDrawVert *pIVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  Glyph *pGVar9;
  value_type *pvVar10;
  int iVar11;
  char *pcVar12;
  char *in_text;
  ImDrawIdx IVar13;
  char *pcVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  uint c;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  ImDrawIdx *local_b0;
  ImDrawVert *local_a8;
  int local_a0;
  int local_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  ulong local_70;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  ImVector<unsigned_short> *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar24 = pos.x;
  fVar17 = pos.y;
  local_88 = size;
  if (text_end == (char *)0x0) {
    fStack_60 = in_XMM1_Dc;
    local_68 = (undefined1  [8])pos;
    fStack_5c = in_XMM1_Dd;
    sVar7 = strlen(text_begin);
    text_end = text_begin + sVar7;
    fVar24 = (float)local_68._0_4_;
    fVar17 = (float)local_68._4_4_;
    in_XMM1_Dc = fStack_60;
    in_XMM1_Dd = fStack_5c;
  }
  local_98 = (this->DisplayOffset).x + (float)(int)fVar24;
  fStack_94 = (this->DisplayOffset).y + (float)(int)fVar17;
  fStack_90 = (float)(int)in_XMM1_Dc + 0.0;
  fStack_8c = (float)(int)in_XMM1_Dd + 0.0;
  if (fStack_94 < clip_rect->w || fStack_94 == clip_rect->w) {
    local_88 = local_88 / this->FontSize;
    fVar24 = this->FontSize * local_88;
    if ((wrap_width <= 0.0) && (fStack_94 + fVar24 < clip_rect->y)) {
      for (; (text_begin < text_end && (*text_begin != '\n')); text_begin = text_begin + 1) {
      }
    }
    iVar11 = (int)text_end - (int)text_begin;
    local_9c = iVar11 * 6;
    local_50 = &draw_list->IdxBuffer;
    local_a0 = (draw_list->IdxBuffer).Size;
    ImDrawList::PrimReserve(draw_list,local_9c,iVar11 * 4);
    local_a8 = draw_list->_VtxWritePtr;
    local_b0 = draw_list->_IdxWritePtr;
    local_70 = (ulong)draw_list->_VtxCurrentIdx;
    local_48 = local_88;
    fStack_44 = local_88;
    fStack_40 = local_88;
    fStack_3c = local_88;
    pcVar8 = (char *)0x0;
    fVar17 = local_98;
    fVar16 = fStack_94;
    fVar26 = fStack_90;
    fVar27 = fStack_8c;
    fVar28 = local_98;
    fVar29 = fStack_94;
    fVar30 = fStack_90;
    fVar21 = fStack_8c;
    fVar25 = local_98;
    fVar23 = fStack_90;
    fVar22 = fStack_8c;
    local_c8 = local_98;
    fStack_c4 = fStack_94;
    fStack_c0 = fStack_90;
    fStack_bc = fStack_8c;
    pcVar14 = pcVar8;
    pcVar12 = text_begin;
LAB_0014d2f9:
    if (text_begin < text_end) {
      in_text = pcVar12;
      pcVar4 = pcVar14;
      fVar15 = fVar28;
      fVar18 = fVar29;
      fVar19 = fVar30;
      fVar20 = fVar21;
      if (0.0 < wrap_width) {
        fVar15 = fVar17;
        fVar18 = fVar16;
        fVar19 = fVar26;
        fVar20 = fVar27;
        if (pcVar8 == (char *)0x0) {
          local_68._4_4_ = fVar16;
          local_68._0_4_ = fVar17;
          fStack_60 = fVar26;
          fStack_5c = fVar27;
          pcVar8 = CalcWordWrapPositionA
                             (this,local_88,text_begin,text_end,(fVar25 - fVar17) + wrap_width);
          pcVar8 = pcVar8 + (pcVar8 == text_begin);
          fVar15 = (float)local_68._0_4_;
          fVar18 = (float)local_68._4_4_;
          fVar19 = fStack_60;
          fVar20 = fStack_5c;
          fVar28 = local_c8;
          fVar29 = fStack_c4;
          fVar30 = fStack_c0;
          fVar21 = fStack_bc;
          fVar25 = local_98;
          fVar23 = fStack_90;
          fVar22 = fStack_8c;
        }
        in_text = text_begin;
        pcVar4 = pcVar8;
        if (pcVar8 <= text_begin) {
          for (; text_begin < text_end; text_begin = text_begin + 1) {
            cVar1 = *text_begin;
            if ((cVar1 != '\t') && (cVar1 != ' ')) {
              text_begin = text_begin + (cVar1 == '\n');
              break;
            }
          }
          pcVar8 = (char *)0x0;
          fVar17 = fVar25;
          fVar16 = fVar18 + fVar24;
          fVar26 = fVar23;
          fVar27 = fVar22;
          goto LAB_0014d2f9;
        }
      }
      pcVar8 = pcVar4;
      c = (uint)*in_text;
      local_c8 = fVar15;
      fStack_c4 = fVar18;
      fStack_c0 = fVar19;
      fStack_bc = fVar20;
      if (*in_text < '\0') {
        uVar5 = ImTextCharFromUtf8(&c,in_text,text_end);
        if (c == 0) goto LAB_0014d753;
        text_begin = in_text + uVar5;
        fVar25 = local_98;
        fVar23 = fStack_90;
        fVar22 = fStack_8c;
      }
      else {
        text_begin = in_text + 1;
      }
      uVar5 = c;
      pcVar14 = pcVar8;
      pcVar12 = text_begin;
      if (c < 0x20) goto code_r0x0014d415;
      goto LAB_0014d489;
    }
LAB_0014d753:
    pIVar3 = local_a8;
    ImVector<ImDrawVert>::resize
              (&draw_list->VtxBuffer,
               (int)(((long)local_a8 - (long)(draw_list->VtxBuffer).Data) / 0x14));
    pIVar2 = local_b0;
    ImVector<unsigned_short>::resize
              (local_50,(int)((ulong)((long)local_b0 - (long)(draw_list->IdxBuffer).Data) >> 1));
    iVar11 = (draw_list->IdxBuffer).Size;
    iVar6 = local_9c + local_a0;
    pvVar10 = ImVector<ImDrawCmd>::operator[]
                        (&draw_list->CmdBuffer,(draw_list->CmdBuffer).Size + -1);
    pvVar10->ElemCount = pvVar10->ElemCount + (iVar11 - iVar6);
    draw_list->_VtxWritePtr = pIVar3;
    draw_list->_IdxWritePtr = pIVar2;
    draw_list->_VtxCurrentIdx = (draw_list->VtxBuffer).Size;
  }
  return;
code_r0x0014d415:
  fVar17 = local_c8;
  fVar16 = fStack_c4;
  fVar26 = fStack_c0;
  fVar27 = fStack_bc;
  fVar28 = local_c8;
  fVar29 = fStack_c4;
  fVar30 = fStack_c0;
  fVar21 = fStack_bc;
  if (c == 0xd) goto LAB_0014d2f9;
  if (c == 10) {
    fVar16 = fStack_c4 + fVar24;
    if (clip_rect->w <= fVar16 && fVar16 != clip_rect->w) goto LAB_0014d753;
    fVar17 = fVar25;
    fVar26 = fVar23;
    fVar27 = fVar22;
    fVar28 = fVar25;
    fVar29 = fVar16;
    fVar30 = fVar23;
    fVar21 = fVar22;
    local_c8 = fVar25;
    fStack_c4 = fVar16;
    fStack_c0 = fVar23;
    fStack_bc = fVar22;
    if ((wrap_width <= 0.0) && (fVar16 + fVar24 < clip_rect->y)) {
      for (; (pcVar12 = text_begin, text_begin < text_end && (*text_begin != '\n'));
          text_begin = text_begin + 1) {
      }
    }
    goto LAB_0014d2f9;
  }
LAB_0014d489:
  pGVar9 = FindGlyph(this,(unsigned_short)c);
  if (pGVar9 == (Glyph *)0x0) {
    fVar17 = 0.0;
  }
  else {
    fVar17 = pGVar9->XAdvance * local_88;
    if ((uVar5 != 9) && (uVar5 != 0x20)) {
      fVar26 = pGVar9->X0 * local_48 + local_c8;
      fVar27 = pGVar9->Y0 * fStack_44 + fStack_c4;
      fVar28 = pGVar9->X1 * fStack_40 + local_c8;
      fVar29 = pGVar9->Y1 * fStack_3c + fStack_c4;
      fVar16 = clip_rect->z;
      if ((fVar26 <= fVar16) && (fVar30 = clip_rect->x, fVar30 <= fVar28)) {
        fVar21 = pGVar9->U0;
        fVar25 = pGVar9->V0;
        fVar23 = pGVar9->U1;
        fVar22 = pGVar9->V1;
        if (cpu_fine_clip) {
          if (fVar26 < fVar30) {
            fVar21 = fVar21 + (fVar23 - fVar21) * (1.0 - (fVar28 - fVar30) / (fVar28 - fVar26));
            fVar26 = fVar30;
          }
          fVar30 = clip_rect->y;
          if (fVar27 < fVar30) {
            fVar25 = fVar25 + (fVar22 - fVar25) * (1.0 - (fVar29 - fVar30) / (fVar29 - fVar27));
            fVar27 = fVar30;
          }
          if (fVar16 < fVar28) {
            fVar23 = (fVar23 - fVar21) * ((fVar16 - fVar26) / (fVar28 - fVar26)) + fVar21;
            fVar28 = fVar16;
          }
          fVar16 = clip_rect->w;
          if (fVar16 < fVar29) {
            fVar22 = (fVar22 - fVar25) * ((fVar16 - fVar27) / (fVar29 - fVar27)) + fVar25;
            fVar29 = fVar16;
          }
          if (fVar29 <= fVar27) goto LAB_0014d59e;
        }
        IVar13 = (ImDrawIdx)local_70;
        *local_b0 = IVar13;
        local_b0[1] = IVar13 + 1;
        local_b0[2] = IVar13 + 2;
        local_b0[3] = IVar13;
        local_b0[4] = IVar13 + 2;
        local_b0[5] = IVar13 + 3;
        (local_a8->pos).x = fVar26;
        (local_a8->pos).y = fVar27;
        local_a8->col = col;
        (local_a8->uv).x = fVar21;
        (local_a8->uv).y = fVar25;
        local_a8[1].pos.x = fVar28;
        local_a8[1].pos.y = fVar27;
        local_a8[1].col = col;
        local_a8[1].uv.x = fVar23;
        local_a8[1].uv.y = fVar25;
        local_a8[2].pos.x = fVar28;
        local_a8[2].pos.y = fVar29;
        local_a8[2].col = col;
        local_a8[2].uv.x = fVar23;
        local_a8[2].uv.y = fVar22;
        local_a8[3].pos.x = fVar26;
        local_a8[3].pos.y = fVar29;
        local_a8[3].col = col;
        local_a8[3].uv.x = fVar21;
        local_a8[3].uv.y = fVar22;
        local_a8 = local_a8 + 4;
        local_70 = (ulong)((int)local_70 + 4);
        local_b0 = local_b0 + 6;
      }
    }
  }
LAB_0014d59e:
  fVar17 = local_c8 + fVar17;
  fVar16 = fStack_c4;
  fVar26 = fStack_c0;
  fVar27 = fStack_bc;
  fVar28 = fVar17;
  fVar29 = fStack_c4;
  fVar30 = fStack_c0;
  fVar21 = fStack_bc;
  fVar25 = local_98;
  fVar23 = fStack_90;
  fVar22 = fStack_8c;
  local_c8 = fVar17;
  goto LAB_0014d2f9;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin);

    // Align to be pixel perfect
    pos.x = (float)(int)pos.x + DisplayOffset.x;
    pos.y = (float)(int)pos.y + DisplayOffset.y;
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Skip non-visible lines
    const char* s = text_begin;
    if (!word_wrap_enabled && y + line_height < clip_rect.y)
        while (s < text_end && *s != '\n')  // Fast-forward to next line
            s++;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsSpace(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0)
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;

                if (y > clip_rect.w)
                    break;
                if (!word_wrap_enabled && y + line_height < clip_rect.y)
                    while (s < text_end && *s != '\n')  // Fast-forward to next line
                        s++;
                continue;
            }
            if (c == '\r')
                continue;
        }

        float char_width = 0.0f;
        if (const Glyph* glyph = FindGlyph((unsigned short)c))
        {
            char_width = glyph->XAdvance * scale;

            // Arbitrarily assume that both space and tabs are empty glyphs as an optimization
            if (c != ' ' && c != '\t')
            {
                // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
                float x1 = x + glyph->X0 * scale;
                float x2 = x + glyph->X1 * scale;
                float y1 = y + glyph->Y0 * scale;
                float y2 = y + glyph->Y1 * scale;
                if (x1 <= clip_rect.z && x2 >= clip_rect.x)
                {
                    // Render a character
                    float u1 = glyph->U0;
                    float v1 = glyph->V0;
                    float u2 = glyph->U1;
                    float v2 = glyph->V1;

                    // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                    if (cpu_fine_clip)
                    {
                        if (x1 < clip_rect.x)
                        {
                            u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                            x1 = clip_rect.x;
                        }
                        if (y1 < clip_rect.y)
                        {
                            v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                            y1 = clip_rect.y;
                        }
                        if (x2 > clip_rect.z)
                        {
                            u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                            x2 = clip_rect.z;
                        }
                        if (y2 > clip_rect.w)
                        {
                            v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                            y2 = clip_rect.w;
                        }
                        if (y1 >= y2)
                        {
                            x += char_width;
                            continue;
                        }
                    }

                    // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug build.
                    // Inlined here:
                    {
                        idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                        idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                        vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                        vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                        vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                        vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                        vtx_write += 4;
                        vtx_current_idx += 4;
                        idx_write += 6;
                    }
                }
            }
        }

        x += char_width;
    }

    // Give back unused vertices
    draw_list->VtxBuffer.resize((int)(vtx_write - draw_list->VtxBuffer.Data));
    draw_list->IdxBuffer.resize((int)(idx_write - draw_list->IdxBuffer.Data));
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size-1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = (unsigned int)draw_list->VtxBuffer.Size;
}